

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * pugi::impl::anon_unknown_0::evaluate_node_set_prepare(xpath_query_impl *impl)

{
  undefined8 *puVar1;
  
  if (impl == (xpath_query_impl *)0x0) {
    return (xpath_ast_node *)0x0;
  }
  if (impl->root->_rettype == '\x01') {
    return impl->root;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar1 = &PTR__exception_00134c10;
  puVar1[1] = "Expression does not evaluate to node set";
  puVar1[2] = 0;
  __cxa_throw(puVar1,&xpath_exception::typeinfo,std::exception::~exception);
}

Assistant:

PUGI__FN impl::xpath_ast_node* evaluate_node_set_prepare(xpath_query_impl* impl)
	{
		if (!impl) return 0;

		if (impl->root->rettype() != xpath_type_node_set)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return 0;
		#else
			xpath_parse_result res;
			res.error = "Expression does not evaluate to node set";

			throw xpath_exception(res);
		#endif
		}

		return impl->root;
	}